

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * sqlite3CreateColumnExpr(sqlite3 *db,SrcList *pSrc,int iSrc,int iCol)

{
  Bitmask *pBVar1;
  Table *pTVar2;
  Expr *pEVar3;
  byte bVar4;
  
  pEVar3 = sqlite3ExprAlloc(db,0xa2,(Token *)0x0,0);
  if (pEVar3 != (Expr *)0x0) {
    pTVar2 = pSrc->a[iSrc].pTab;
    (pEVar3->y).pTab = pTVar2;
    pEVar3->iTable = pSrc->a[iSrc].iCursor;
    if (pTVar2->iPKey == iCol) {
      pEVar3->iColumn = -1;
    }
    else {
      bVar4 = 0x3f;
      if (iCol < 0x3f) {
        bVar4 = (byte)iCol;
      }
      pEVar3->iColumn = (ynVar)iCol;
      pBVar1 = &pSrc->a[iSrc].colUsed;
      *pBVar1 = *pBVar1 | 1L << (bVar4 & 0x3f);
    }
  }
  return pEVar3;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3CreateColumnExpr(sqlite3 *db, SrcList *pSrc, int iSrc, int iCol){
  Expr *p = sqlite3ExprAlloc(db, TK_COLUMN, 0, 0);
  if( p ){
    struct SrcList_item *pItem = &pSrc->a[iSrc];
    p->y.pTab = pItem->pTab;
    p->iTable = pItem->iCursor;
    if( p->y.pTab->iPKey==iCol ){
      p->iColumn = -1;
    }else{
      p->iColumn = (ynVar)iCol;
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      pItem->colUsed |= ((Bitmask)1)<<(iCol>=BMS ? BMS-1 : iCol);
    }
  }
  return p;
}